

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

int64_t my_pow(int64_t base,int64_t exponent)

{
  int i;
  int64_t z;
  int64_t exponent_local;
  int64_t base_local;
  undefined8 local_8;
  
  if (exponent == 0) {
    local_8 = 1;
  }
  else if (base == 0) {
    local_8 = 0;
  }
  else {
    z = base;
    for (i = 1; i < exponent; i = i + 1) {
      z = base * z;
    }
    local_8 = z;
  }
  return local_8;
}

Assistant:

int64_t my_pow(const int64_t base, const int64_t exponent) {
	assert(exponent >= 0);
	if (exponent == 0) {
		return 1;
	}
	if (base == 0) {
		return 0;
	}
	int64_t z = base;
	for (int i = 1; i < exponent; i++) {
		z *= base;
	}
	return z;
}